

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O2

int __thiscall sqlite::Connection::Stmt::bind(Stmt *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  sqlite3_stmt *psVar1;
  undefined8 uVar2;
  int iVar3;
  Logic_error *this_00;
  char *pcVar4;
  undefined4 in_register_00000034;
  allocator local_a9;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  psVar1 = this->stmt_;
  iVar3 = bind_parameter_index(this,(string *)CONCAT44(in_register_00000034,__fd));
  uVar2._0_2_ = __addr->sa_family;
  uVar2._2_1_ = __addr->sa_data[0];
  uVar2._3_1_ = __addr->sa_data[1];
  uVar2._4_1_ = __addr->sa_data[2];
  uVar2._5_1_ = __addr->sa_data[3];
  uVar2._6_1_ = __addr->sa_data[4];
  uVar2._7_1_ = __addr->sa_data[5];
  iVar3 = sqlite3_bind_text(psVar1,iVar3,uVar2,*(undefined4 *)(__addr->sa_data + 6),
                            0xffffffffffffffff);
  if (iVar3 == 0) {
    return iVar3;
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_88,"Error binding ",(string *)CONCAT44(in_register_00000034,__fd));
  std::operator+(&local_68,&local_88,": ");
  pcVar4 = (char *)sqlite3_errmsg(this->db_);
  std::operator+(&local_48,&local_68,pcVar4);
  pcVar4 = (char *)sqlite3_sql(this->stmt_);
  std::__cxx11::string::string((string *)&local_a8,pcVar4,&local_a9);
  Logic_error::Logic_error(this_00,&local_48,&local_a8,iVar3,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::Stmt::bind(const std::string & name, const std::string & val)
    {
        int status = sqlite3_bind_text(stmt_, bind_parameter_index(name), val.c_str(), val.length(), SQLITE_TRANSIENT);
        if(status != SQLITE_OK)
        {
            throw Logic_error("Error binding " + name +
                ": " + sqlite3_errmsg(db_), sqlite3_sql(stmt_), status, db_);
        }
    }